

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPruning.cpp
# Opt level: O2

ValueFunctionPOMDPDiscrete *
AlphaVectorPruning::Prune
          (ValueFunctionPOMDPDiscrete *__return_storage_ptr__,ValueFunctionPOMDPDiscrete *Vin,
          size_t acceleratedPruningThreshold)

{
  pointer pdVar1;
  pointer pdVar2;
  bool bVar3;
  reference pvVar4;
  ValueFunctionPOMDPDiscrete all;
  vector<double,_std::allocator<double>_> belief;
  ValueFunctionPOMDPDiscrete in;
  AlphaVector curr;
  allocator_type local_91;
  vector<AlphaVector,_std::allocator<AlphaVector>_> local_90;
  value_type_conflict3 local_78;
  _Vector_base<double,_std::allocator<double>_> local_70;
  ValueFunctionPOMDPDiscrete local_58;
  AlphaVector local_40;
  
  if ((Vin->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (Vin->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::vector(__return_storage_ptr__,Vin);
  }
  else {
    ParetoPrune(&local_58,Vin);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::vector(&local_90,&local_58);
    (__return_storage_ptr__->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pvVar4 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::at(&local_90,0);
    if (local_90.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_90.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pdVar1 = (pvVar4->_m_values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar2 = (pvVar4->_m_values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pvVar4 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::at(&local_90,0);
      AlphaVector::AlphaVector(&local_40,pvVar4);
      local_78 = 0.0;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_70,
                 (ulong)((long)pdVar1 - (long)pdVar2) >> 3 & 0xffffffff,&local_78,&local_91);
      bVar3 = FindBelief(&local_40,__return_storage_ptr__,
                         (vector<double,_std::allocator<double>_> *)&local_70,
                         acceleratedPruningThreshold);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_70);
      AlphaVector::~AlphaVector(&local_40);
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(__return_storage_ptr__);
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_90);
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_58);
      _Unwind_Resume(bVar3);
    }
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_90);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

ValueFunctionPOMDPDiscrete AlphaVectorPruning::Prune(const ValueFunctionPOMDPDiscrete &Vin,
                                                     size_t acceleratedPruningThreshold)
{
    if(Vin.size()==0)
        return(Vin);

    // remove alpha vectors that are dominated by a single other alpha
    // vector, can be done by checking only the corners of the belief
    // simplex
    ValueFunctionPOMDPDiscrete in = ParetoPrune(Vin);

#if DEBUG_AlphaVectorPruning
#if 0
    cout << "AlphaVectorPruning original value function: ";
    for(VFPDcit j=Vin.begin();j!=Vin.end();++j)
        cout << SoftPrintVector(j->GetValues()) << " ";
    cout << endl;
#endif
    cout << "AlphaVectorPruning after ParetoPrune (reduced from " << Vin.size()
         << " to " << in.size() << " vectors):" << endl;
    for(VFPDcit j=in.begin();j!=in.end();++j)
        cout << SoftPrintVector(j->GetValues()) << endl;
#endif

    ValueFunctionPOMDPDiscrete all(in);
    ValueFunctionPOMDPDiscrete Vpruned;

    size_t nrStates = all.at(0).GetNrValues();
		
    while(all.size()>0)
    {
        AlphaVector curr=all.at(0);
        bool foundBelief=false;
        vector<double> belief(nrStates,0);
        foundBelief = FindBelief(curr, Vpruned, belief, acceleratedPruningThreshold);
        if(foundBelief)
        {
            // we found a belief for which curr is not dominated, now
            // find the corresponding vector
            double highest=-DBL_MAX;
            for (Index i=0;i!=all.size();++i)
            {
                double value=InnerProduct(all.at(i), belief);
                if( value>highest ||
                    (Globals::EqualReward(value,highest) && LexGreater(all.at(i),curr)))
                {
                    curr = all.at(i);
                    highest = value;
                }
            }
            Vpruned.push_back(curr);
#if DEBUG_AlphaVectorPruning
            cout << "AlphaVectorPruning adding vector for belief " << SoftPrintVector(belief) << ":"
                 << SoftPrintVector(curr.GetValues())
                 << endl;
#endif
            RemoveFirstOccurrence(all,curr);
        }
        else
            RemoveFirst(all);
    }
    return(Vpruned);
}